

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::majorUpdate(HEkkDual *this)

{
  int iVar1;
  HEkk *this_00;
  bool bVar2;
  long lVar3;
  HighsInt *pHVar4;
  allocator local_61;
  double *local_60;
  HVector_ptr local_58;
  string local_50;
  
  if (this->rebuild_reason == 0) {
    if (this->multi_chooseAgain == 0) {
      return;
    }
  }
  else {
    this->multi_chooseAgain = 1;
  }
  majorUpdateFtranPrepare(this);
  majorUpdateFtranParallel(this);
  majorUpdateFtranFinal(this);
  local_60 = &this->numericalTrouble;
  pHVar4 = &this->multi_finish[0].row_out;
  lVar3 = -1;
  do {
    lVar3 = lVar3 + 1;
    if (this->multi_nFinish <= lVar3) {
      majorUpdatePrimal(this);
      majorUpdateFactor(this);
      if (this->new_devex_framework == true) {
        initialiseDevexFramework(this);
      }
      iterationAnalysisMajor(this);
      return;
    }
    local_58 = *(HVector_ptr *)(pHVar4 + 0x10);
    iVar1 = *pHVar4;
    this_00 = this->ekk_instance_;
    std::__cxx11::string::string((string *)&local_50,"HEkkDual::majorUpdate",&local_61);
    bVar2 = HEkk::reinvertOnNumericalTrouble
                      (this_00,&local_50,local_60,
                       (local_58->array).super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start[iVar1],*(double *)(pHVar4 + 4),1e-07);
    pHVar4 = pHVar4 + 0x1e;
    std::__cxx11::string::~string((string *)&local_50);
  } while (!bVar2);
  this->rebuild_reason = 7;
  majorRollback(this);
  return;
}

Assistant:

void HEkkDual::majorUpdate() {
  /**
   * 0. See if it's ready to perform a major update
   */
  if (rebuild_reason) multi_chooseAgain = 1;
  if (!multi_chooseAgain) return;

  // Major update - FTRANs
  majorUpdateFtranPrepare();
  majorUpdateFtranParallel();
  majorUpdateFtranFinal();

  // Major update - check for roll back
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* iFinish = &multi_finish[iFn];
    HVector* iColumn = iFinish->col_aq;
    HighsInt iRow_Out = iFinish->row_out;

    // Use the two pivot values to identify numerical trouble
    if (ekk_instance_.reinvertOnNumericalTrouble(
            "HEkkDual::majorUpdate", numericalTrouble, iColumn->array[iRow_Out],
            iFinish->alpha_row, kMultiNumericalTroubleTolerance)) {
      // HighsInt startUpdate = ekk_instance_.info_.update_count -
      // multi_nFinish;
      rebuild_reason = kRebuildReasonPossiblySingularBasis;
      // if (startUpdate > 0) {
      majorRollback();
      return;
      // }
    }
  }

  // Major update - primal and factor
  majorUpdatePrimal();
  majorUpdateFactor();
  if (new_devex_framework) initialiseDevexFramework();
  iterationAnalysisMajor();
}